

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmTimeZone::get_name_list(CVmTimeZone *this)

{
  vm_obj_id_t vVar1;
  vm_val_t *this_00;
  char *pcVar2;
  long *in_RDI;
  ZoneHashEntryLink *link;
  vm_val_t ele;
  int idx;
  CVmObjList *lst;
  vm_obj_id_t lstid;
  ZoneHashEntryLink *e;
  int cnt;
  size_t in_stack_ffffffffffffff88;
  CVmObjList *in_stack_ffffffffffffff90;
  CVmObjList *this_01;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int iVar3;
  CVmHashEntry *local_48;
  vm_val_t local_40;
  int local_2c;
  CVmObject *local_28;
  vm_obj_id_t local_1c;
  long local_18;
  int local_c;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_c = 0;
  if (*in_RDI == 0) {
    if (in_RDI[1] == 0) {
      if ((in_RDI[8] != 0) && (*(char *)in_RDI[8] != '\0')) {
        local_c = 1;
      }
    }
    else {
      local_c = 1;
    }
  }
  else {
    local_c = 1;
    for (local_18 = *(long *)(*in_RDI + 0x30); local_18 != 0; local_18 = *(long *)(local_18 + 0x48))
    {
      local_c = local_c + 1;
    }
  }
  local_1c = CVmObjList::create((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                                in_stack_ffffffffffffff88);
  this_00 = CVmStack::push();
  vm_val_t::set_obj(this_00,local_1c);
  local_28 = vm_objp(0);
  CVmObjList::cons_clear(in_stack_ffffffffffffff90);
  local_2c = 0;
  if (*in_RDI == 0) {
    if (in_RDI[1] == 0) {
      if ((in_RDI[8] != 0) && (*(char *)in_RDI[8] != '\0')) {
        this_01 = (CVmObjList *)in_RDI[8];
        strlen((char *)in_RDI[8]);
        vVar1 = CVmObjString::create(iVar3,in_stack_ffffffffffffff98,(size_t)this_01);
        vm_val_t::set_obj(&local_40,vVar1);
        local_2c = local_2c + 1;
        CVmObjList::cons_set_element(this_01,in_stack_ffffffffffffff88,(vm_val_t *)0x34fd93);
      }
    }
    else {
      pcVar2 = (char *)in_RDI[1];
      strlen((char *)in_RDI[1]);
      vVar1 = CVmObjString::create(iVar3,pcVar2,(size_t)in_stack_ffffffffffffff90);
      vm_val_t::set_obj(&local_40,vVar1);
      local_2c = local_2c + 1;
      CVmObjList::cons_set_element
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(vm_val_t *)0x34fd23);
    }
  }
  else {
    CVmHashEntry::getstr((CVmHashEntry *)*in_RDI);
    CVmHashEntry::getlen((CVmHashEntry *)*in_RDI);
    vVar1 = CVmObjString::create(iVar3,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
    vm_val_t::set_obj(&local_40,vVar1);
    local_2c = local_2c + 1;
    CVmObjList::cons_set_element
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(vm_val_t *)0x34fc45);
    for (local_48 = *(CVmHashEntry **)(*in_RDI + 0x30); local_48 != (CVmHashEntry *)0x0;
        local_48 = *(CVmHashEntry **)&local_48[1].field_0x20) {
      pcVar2 = CVmHashEntry::getstr(local_48);
      iVar3 = (int)((ulong)pcVar2 >> 0x20);
      CVmHashEntry::getlen(local_48);
      vVar1 = CVmObjString::create
                        (iVar3,in_stack_ffffffffffffff98,(size_t)in_stack_ffffffffffffff90);
      vm_val_t::set_obj(&local_40,vVar1);
      local_2c = local_2c + 1;
      CVmObjList::cons_set_element
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(vm_val_t *)0x34fcb1);
    }
  }
  CVmStack::discard();
  return local_1c;
}

Assistant:

vm_obj_id_t CVmTimeZone::get_name_list(VMG0_) const
{
    /* no names found so far */
    int cnt = 0;

    /* count names, depending on what information we have */
    if (hashentry_ != 0)
    {
        /* the hash entry gives us our primary name */
        cnt += 1;
        
        /* count incoming alias links */
        for (ZoneHashEntryLink *e = hashentry_->link_from ; e != 0 ;
             e = e->link_nxt, ++cnt) ;
    }
    else if (name_ != 0)
    {
        /* we have only the one primary name */
        cnt += 1;
    }
    else if (abbr_ != 0 && abbr_[0] != '\0')
    {
        /* no name, but we at least have an abbreviation we can use in lieu */
        cnt += 1;
    }

    /* allocate the result list; stack it for gc protection */
    vm_obj_id_t lstid = CVmObjList::create(vmg_ FALSE, cnt);
    G_stk->push()->set_obj(lstid);
    CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ lstid);
    lst->cons_clear();

    /* start at index 0 */
    int idx = 0;
    vm_val_t ele;

    /* 
     *   add our primary name - this is our explicit name_ string, our hash
     *   entry name, or our primary abbreviation (in order of priority) 
     */
    if (hashentry_ != 0)
    {
        /* set the name from our hash entry */
        ele.set_obj(CVmObjString::create(
            vmg_ FALSE, hashentry_->getstr(), hashentry_->getlen()));
        lst->cons_set_element(idx++, &ele);

        /* add our aliases */
        for (ZoneHashEntryLink *link = hashentry_->link_from ; link != 0 ;
             link = link->link_nxt)
        {
            ele.set_obj(CVmObjString::create(
                vmg_ FALSE, link->getstr(), link->getlen()));
            lst->cons_set_element(idx++, &ele);
        }
    }
    else if (name_ != 0)
    {
        /* the first item is our primary name */
        ele.set_obj(CVmObjString::create(vmg_ FALSE, name_, strlen(name_)));
        lst->cons_set_element(idx++, &ele);
    }
    else if (abbr_ != 0 && abbr_[0] != '\0')
    {
        /* use our primary abbreviation as our name */
        ele.set_obj(CVmObjString::create(vmg_ FALSE, abbr_, strlen(abbr_)));
        lst->cons_set_element(idx++, &ele);
    }

    /* discard the gc protection */
    G_stk->discard();

    /* return the new list object */
    return lstid;
}